

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void vera::setWindowIcon(uchar *_data,size_t _width,size_t _height)

{
  undefined1 local_30 [8];
  GLFWimage image;
  size_t _height_local;
  size_t _width_local;
  uchar *_data_local;
  
  local_30._0_4_ = (undefined4)_width;
  local_30._4_4_ = (undefined4)_height;
  image._0_8_ = _data;
  image.pixels = (uchar *)_height;
  glfwSetWindowIcon(window,1,(GLFWimage *)local_30);
  return;
}

Assistant:

void setWindowIcon(unsigned char* _data, size_t _width, size_t _height) {
#if defined(DRIVER_GLFW)
    GLFWimage image;
    image.pixels = _data;
    image.width = _width;
    image.height = _height;
    glfwSetWindowIcon(window, 1, &image);
#endif
}